

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::commit_wait(NonblockingNotifierV2 *this,Waiter *w)

{
  ulong *puVar1;
  reference pvVar2;
  Waiter *pWVar3;
  ulong *in_RSI;
  ulong *in_RDI;
  uint64_t newstate;
  uint64_t state;
  uint64_t me;
  memory_order __b_1;
  memory_order __b;
  memory_order in_stack_fffffffffffffdf4;
  Waiter *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  Waiter *local_b0;
  Waiter *local_a8;
  ulong local_a0;
  ulong *local_98;
  ulong local_88;
  memory_order local_80;
  int local_7c;
  ulong local_78;
  ulong *local_70;
  Waiter *local_68;
  memory_order local_60;
  int local_5c;
  undefined4 local_4c;
  Waiter *local_48;
  Waiter **local_40;
  bool local_29;
  Waiter *local_28;
  memory_order local_20;
  undefined4 local_1c;
  Waiter *local_18;
  Waiter **local_10;
  
  *(undefined4 *)(in_RSI + 0xd) = 0;
  local_98 = in_RSI;
  pvVar2 = std::
           vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
           ::operator[]((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                         *)(in_RDI + 1),0);
  local_a0 = (long)in_RSI - (long)pvVar2 >> 7 | local_98[1];
  local_5c = 5;
  local_60 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_5c - 1U < 2) {
    local_68 = (Waiter *)*in_RDI;
  }
  else if (local_5c == 5) {
    local_68 = (Waiter *)*in_RDI;
  }
  else {
    local_68 = (Waiter *)*in_RDI;
  }
  local_a8 = local_68;
  do {
    puVar1 = local_98;
    if (((ulong)local_a8 & 0x3fff0000000) == 0) {
      local_b0 = (Waiter *)((ulong)((uint)local_a8 & 0xfffc000) - 0x4000 | local_a0);
      local_78 = (ulong)local_a8 & 0xfffffc0000003fff;
      local_70 = local_98;
      local_7c = 0;
      local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
      local_88 = local_78;
      if (local_7c == 3) {
        *puVar1 = local_78;
      }
      else if (local_7c == 5) {
        LOCK();
        *puVar1 = local_78;
        UNLOCK();
      }
      else {
        *puVar1 = local_78;
      }
    }
    else {
      local_b0 = local_a8 + -0x200080;
    }
    local_48 = local_b0;
    local_4c = 4;
    local_40 = &local_a8;
    local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffdf4);
    local_18 = local_b0;
    local_1c = 4;
    local_28 = local_b0;
    switch(0x12896e) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        in_stack_fffffffffffffe07 = local_a8 == pWVar3;
        if ((bool)in_stack_fffffffffffffe07) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffe07;
        if (!(bool)in_stack_fffffffffffffe07) {
          local_a8 = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        in_stack_fffffffffffffdf8 = (Waiter *)*in_RDI;
        local_29 = local_a8 == in_stack_fffffffffffffdf8;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          in_stack_fffffffffffffdf8 = local_a8;
        }
        UNLOCK();
        in_stack_fffffffffffffdf4 = CONCAT13(local_29,(int3)in_stack_fffffffffffffdf4);
        if (!local_29) {
          local_a8 = in_stack_fffffffffffffdf8;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_a8 == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_b0;
          pWVar3 = local_a8;
        }
        UNLOCK();
        if (!local_29) {
          local_a8 = pWVar3;
        }
      }
    }
    local_10 = &local_a8;
  } while (local_29 == false);
  if (((ulong)local_a8 & 0x3fff0000000) == 0) {
    local_98[1] = local_98[1] + 0x40000000000;
    _park((NonblockingNotifierV2 *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
          in_stack_fffffffffffffdf8);
  }
  return;
}

Assistant:

void commit_wait(Waiter* w) {
#if __cplusplus >= TF_CPP20
    w->state.store(Waiter::kNotSignaled, std::memory_order_relaxed);
#else
    w->state = Waiter::kNotSignaled;
#endif
    const uint64_t me = (w - &_waiters[0]) | w->epoch;
    uint64_t state = _state.load(std::memory_order_seq_cst);
    for (;;) {
      //_check_state(state, true);
      uint64_t newstate;
      if ((state & kSignalMask) != 0) {
        // Consume the signal and return immediately.
        newstate = state - kWaiterInc - kSignalInc;
      } else {
        // Remove this thread from pre-wait counter and add to the waiter stack.
        newstate = ((state & kWaiterMask) - kWaiterInc) | me;
        w->next.store(state & (kStackMask | kEpochMask), std::memory_order_relaxed);
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if ((state & kSignalMask) == 0) {
          w->epoch += kEpochInc;
          _park(w);
        }
        return;
      }
    }
  }